

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawSlabPalCommand::Execute(DrawSlabPalCommand *this,DrawerThread *thread)

{
  uchar uVar1;
  int pitch_00;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar *dest_00;
  uint8_t *puVar5;
  uint8_t *puVar6;
  int iVar7;
  int local_50;
  int x;
  int iStack_44;
  uint8_t color;
  fixed_t iscale;
  fixed_t fracpos;
  uint8_t *source;
  uint8_t *colormap;
  int width;
  int pitch;
  uint8_t *dest;
  int count;
  DrawerThread *thread_local;
  DrawSlabPalCommand *this_local;
  
  dest_00 = this->_p;
  pitch_00 = this->_pitch;
  iVar2 = *(int *)&(this->super_PalSpanCommand).field_0x64;
  puVar5 = this->_colormap;
  puVar6 = this->_vvptr;
  iStack_44 = this->_v;
  iVar3 = this->_vi;
  dest._4_4_ = DrawerThread::count_for_thread(thread,this->_start_y,this->_dy);
  _width = DrawerThread::dest_for_thread<unsigned_char>(thread,this->_start_y,pitch_00,dest_00);
  iVar7 = DrawerThread::skipped_by_thread(thread,this->_start_y);
  iStack_44 = iVar3 * iVar7 + iStack_44;
  iVar7 = thread->num_cores;
  iVar4 = thread->num_cores;
  for (; 0 < dest._4_4_; dest._4_4_ = dest._4_4_ + -1) {
    uVar1 = puVar5[puVar6[iStack_44 >> 0x10]];
    for (local_50 = 0; local_50 < iVar2; local_50 = local_50 + 1) {
      _width[local_50] = uVar1;
    }
    _width = _width + iVar4 * pitch_00;
    iStack_44 = iVar7 * iVar3 + iStack_44;
  }
  return;
}

Assistant:

void DrawSlabPalCommand::Execute(DrawerThread *thread)
	{
		int count = _dy;
		uint8_t *dest = _p;
		int pitch = _pitch;
		int width = _dx;
		const uint8_t *colormap = _colormap;
		const uint8_t *source = _vvptr;
		fixed_t fracpos = _v;
		fixed_t iscale = _vi;

		count = thread->count_for_thread(_start_y, count);
		dest = thread->dest_for_thread(_start_y, pitch, dest);
		fracpos += iscale * thread->skipped_by_thread(_start_y);
		iscale *= thread->num_cores;
		pitch *= thread->num_cores;

		while (count > 0)
		{
			uint8_t color = colormap[source[fracpos >> FRACBITS]];

			for (int x = 0; x < width; x++)
				dest[x] = color;

			dest += pitch;
			fracpos += iscale;
			count--;
		}
	}